

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O0

void connect1_cb(uv_connect_t *req,int status)

{
  uv_stream_t *handle;
  int iVar1;
  uv_loop_t *loop;
  uv_buf_t uVar2;
  uv_stream_t *local_48;
  char *local_40;
  int r;
  uv_stream_t *stream;
  uv_buf_t buf;
  int status_local;
  uv_connect_t *req_local;
  
  handle = connect_req.handle;
  buf.len._4_4_ = status;
  if (req != &connect_req) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-open.c"
            ,0xd6,"req == &connect_req");
    abort();
  }
  if (status != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-open.c"
            ,0xd7,"status == 0");
    abort();
  }
  connect_cb_called = connect_cb_called + 1;
  loop = uv_default_loop();
  iVar1 = uv_timer_init(loop,&tm);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-open.c"
            ,0xdd,"r == 0");
    abort();
  }
  iVar1 = uv_timer_start(&tm,timer_cb,2000,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-open.c"
            ,0xe0,"r == 0");
    abort();
  }
  uVar2 = uv_buf_init("P",1);
  local_48 = (uv_stream_t *)uVar2.base;
  stream = local_48;
  local_40 = (char *)uVar2.len;
  buf.base = local_40;
  iVar1 = uv_write(&write_req,handle,(uv_buf_t *)&stream,1,write1_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-open.c"
            ,0xe4,"r == 0");
    abort();
  }
  iVar1 = uv_read_start(handle,alloc_cb,read1_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-open.c"
            ,0xe8,"r == 0");
    abort();
  }
  return;
}

Assistant:

static void connect1_cb(uv_connect_t* req, int status) {
  uv_buf_t buf;
  uv_stream_t* stream;
  int r;

  ASSERT(req == &connect_req);
  ASSERT(status == 0);

  stream = req->handle;
  connect_cb_called++;

  r = uv_timer_init(uv_default_loop(), &tm);
  ASSERT(r == 0);

  r = uv_timer_start(&tm, timer_cb, 2000, 0);
  ASSERT(r == 0);

  buf = uv_buf_init("P", 1);
  r = uv_write(&write_req, stream, &buf, 1, write1_cb);
  ASSERT(r == 0);

  /* Start reading */
  r = uv_read_start(stream, alloc_cb, read1_cb);
  ASSERT(r == 0);
}